

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

optional<cmList> *
anon_unknown.dwarf_61b316::GetList
          (optional<cmList> *__return_storage_ptr__,string *var,cmMakefile *makefile)

{
  bool bVar1;
  PolicyStatus PVar2;
  PolicyID id;
  PolicyID id_00;
  optional<cmList> list;
  string warn;
  string listString;
  string local_38;
  
  list.super__Optional_base<cmList,_false,_false>._M_payload.
  super__Optional_payload<cmList,_true,_false,_false>.super__Optional_payload_base<cmList>.
  _M_engaged = false;
  listString._M_dataplus._M_p = (pointer)&listString.field_2;
  listString._M_string_length = 0;
  listString.field_2._M_local_buf[0] = '\0';
  bVar1 = GetListString(&listString,var,makefile);
  if (!bVar1) goto switchD_00232de4_caseD_2;
  if (listString._M_string_length != 0) {
    warn._M_dataplus._M_p._0_4_ = 1;
    std::optional<cmList>::emplace<std::__cxx11::string&,cmList::EmptyElements>
              (&list,&listString,(EmptyElements *)&warn);
    warn._M_dataplus._M_p = (pointer)&warn.field_2;
    warn._M_string_length = 0;
    warn.field_2._M_local_buf[0] = '\0';
    bVar1 = ::cm::
            contains<cmList,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((cmList *)&list,&warn);
    std::__cxx11::string::~string((string *)&warn);
    if (!bVar1) goto switchD_00232de4_caseD_2;
    PVar2 = cmMakefile::GetPolicyStatus(makefile,CMP0007,false);
    switch(PVar2) {
    case OLD:
      cmList::assign((cmList *)&list,&listString,Yes,No);
    default:
switchD_00232de4_caseD_2:
LAB_00232eb5:
      std::_Optional_base<cmList,_false,_false>::_Optional_base
                (&__return_storage_ptr__->super__Optional_base<cmList,_false,_false>,
                 &list.super__Optional_base<cmList,_false,_false>);
      break;
    case WARN:
      cmList::assign((cmList *)&list,&listString,Yes,No);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_38,(cmPolicies *)0x7,id_00);
      cmStrCat<std::__cxx11::string,char_const(&)[20],std::__cxx11::string&,char_const(&)[3]>
                (&warn,&local_38,(char (*) [20])" List has value = [",&listString,
                 (char (*) [3])0x6702a0);
      std::__cxx11::string::~string((string *)&local_38);
      cmMakefile::IssueMessage(makefile,AUTHOR_WARNING,&warn);
      std::_Optional_base<cmList,_false,_false>::_Optional_base
                (&__return_storage_ptr__->super__Optional_base<cmList,_false,_false>,
                 &list.super__Optional_base<cmList,_false,_false>);
      std::__cxx11::string::~string((string *)&warn);
      break;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&warn,(cmPolicies *)0x7,id);
      cmMakefile::IssueMessage(makefile,FATAL_ERROR,&warn);
      std::__cxx11::string::~string((string *)&warn);
      (__return_storage_ptr__->super__Optional_base<cmList,_false,_false>)._M_payload.
      super__Optional_payload<cmList,_true,_false,_false>.super__Optional_payload_base<cmList>.
      _M_engaged = false;
    }
    std::__cxx11::string::~string((string *)&listString);
    std::_Optional_payload_base<cmList>::_M_reset((_Optional_payload_base<cmList> *)&list);
    return __return_storage_ptr__;
  }
  std::optional<cmList>::emplace<>(&list);
  goto LAB_00232eb5;
}

Assistant:

cm::optional<cmList> GetList(const std::string& var,
                             const cmMakefile& makefile)
{
  cm::optional<cmList> list;

  std::string listString;
  if (!GetListString(listString, var, makefile)) {
    return list;
  }
  // if the size of the list
  if (listString.empty()) {
    list.emplace();
    return list;
  }
  // expand the variable into a list
  list.emplace(listString, cmList::EmptyElements::Yes);
  // if no empty elements then just return
  if (!cm::contains(*list, std::string())) {
    return list;
  }
  // if we have empty elements we need to check policy CMP0007
  switch (makefile.GetPolicyStatus(cmPolicies::CMP0007)) {
    case cmPolicies::WARN: {
      // Default is to warn and use old behavior
      // OLD behavior is to allow compatibility, so recall
      // ExpandListArgument without the true which will remove
      // empty values
      list->assign(listString);
      std::string warn =
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0007),
                 " List has value = [", listString, "].");
      makefile.IssueMessage(MessageType::AUTHOR_WARNING, warn);
      return list;
    }
    case cmPolicies::OLD:
      // OLD behavior is to allow compatibility, so recall
      // ExpandListArgument without the true which will remove
      // empty values
      list->assign(listString);
      return list;
    case cmPolicies::NEW:
      return list;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      makefile.IssueMessage(
        MessageType::FATAL_ERROR,
        cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0007));
      return {};
  }
  return list;
}